

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O1

monst * findgd(void)

{
  monst *pmVar1;
  boolean bVar2;
  
  pmVar1 = level->monlist;
  while( true ) {
    if (pmVar1 == (monst *)0x0) {
      return (monst *)0x0;
    }
    if ((((pmVar1->field_0x63 & 8) != 0) && (0 < pmVar1->mhp)) &&
       (bVar2 = on_level((d_level *)((long)&pmVar1[1].data + 4),&u.uz), bVar2 != '\0')) break;
    pmVar1 = pmVar1->nmon;
  }
  return pmVar1;
}

Assistant:

static struct monst *findgd(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (mtmp->isgd && !DEADMONSTER(mtmp) && on_level(&(EGD(mtmp)->gdlevel), &u.uz))
		return mtmp;
	return NULL;
}